

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

bool __thiscall slang::parsing::Parser::isSequenceRepetition(Parser *this)

{
  Token TVar1;
  TokenKind local_38;
  int local_28;
  Parser *this_local;
  
  TVar1 = ParserBase::peek(&this->super_ParserBase,1);
  local_28 = TVar1._0_4_;
  switch(local_28 - 0x1eU & 0xffff) {
  case 0:
  case 9:
  case 0x17:
    this_local._7_1_ = true;
    break;
  default:
    this_local._7_1_ = false;
    break;
  case 3:
    TVar1 = ParserBase::peek(&this->super_ParserBase,2);
    local_38 = TVar1.kind;
    this_local._7_1_ = local_38 == CloseBracket;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::isSequenceRepetition() {
    switch (peek(1).kind) {
        case TokenKind::Star:
        case TokenKind::Equals:
        case TokenKind::MinusArrow:
            return true;
        case TokenKind::Plus:
            return peek(2).kind == TokenKind::CloseBracket;
        default:
            return false;
    }
}